

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O2

ER __thiscall slang::ast::CaseStatement::evalImpl(CaseStatement *this,EvalContext *context)

{
  ER EVar1;
  ER EVar2;
  pair<const_slang::ast::Statement_*,_bool> pVar3;
  
  pVar3 = getKnownBranch(this,context);
  EVar2 = Fail;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (pVar3.first != (Statement *)0x0) {
      EVar1 = Statement::eval(pVar3.first,context);
      return EVar1;
    }
    EVar2 = Success;
  }
  return EVar2;
}

Assistant:

ER CaseStatement::evalImpl(EvalContext& context) const {
    auto [matchedStmt, success] = getKnownBranch(context);
    if (!success)
        return ER::Fail;

    if (matchedStmt)
        return matchedStmt->eval(context);

    return ER::Success;
}